

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v7::detail::format_uint<4u,char,unsigned__int128>
          (detail *this,char *buffer,unsigned___int128 value,int num_digits,bool upper)

{
  ulong uVar1;
  int iVar2;
  undefined7 in_register_00000009;
  char *pcVar3;
  undefined4 in_register_00000014;
  detail *pdVar4;
  int in_R8D;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  
  iVar2 = (int)CONCAT71(in_register_00000009,upper);
  pcVar3 = "0123456789abcdef";
  if (in_R8D != 0) {
    pcVar3 = "0123456789ABCDEF";
  }
  pdVar4 = this + iVar2;
  uVar5 = CONCAT44(in_register_00000014,num_digits);
  do {
    pdVar4 = pdVar4 + -1;
    *pdVar4 = *(detail *)(pcVar3 + ((uint)buffer & 0xf));
    bVar6 = (char *)0xf < buffer;
    bVar7 = uVar5 != 0;
    uVar1 = -uVar5;
    buffer = (char *)(uVar5 << 0x3c | (ulong)buffer >> 4);
    uVar5 = uVar5 >> 4;
  } while (bVar7 || uVar1 < bVar6);
  return (char *)(this + iVar2);
}

Assistant:

inline Char* format_uint(Char* buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : "0123456789abcdef";
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}